

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O0

int luaB_unpack(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  size_t sVar3;
  int local_28;
  int n;
  int e;
  int i;
  lua_State *L_local;
  
  luaL_checktype(L,1,5);
  lVar2 = luaL_optinteger(L,2,1);
  n = (int)lVar2;
  iVar1 = lua_type(L,3);
  if (iVar1 < 1) {
    sVar3 = lua_objlen(L,1);
    local_28 = (int)sVar3;
  }
  else {
    lVar2 = luaL_checkinteger(L,3);
    local_28 = (int)lVar2;
  }
  if (local_28 < n) {
    L_local._4_4_ = 0;
  }
  else {
    L_local._4_4_ = (local_28 - n) + 1;
    if ((L_local._4_4_ < 1) || (iVar1 = lua_checkstack(L,L_local._4_4_), iVar1 == 0)) {
      L_local._4_4_ = luaL_error(L,"too many results to unpack");
    }
    else {
      lua_rawgeti(L,1,n);
      while (n < local_28) {
        lua_rawgeti(L,1,n + 1);
        n = n + 1;
      }
    }
  }
  return L_local._4_4_;
}

Assistant:

static int luaB_unpack (lua_State *L) {
  int i, e, n;
  luaL_checktype(L, 1, LUA_TTABLE);
  i = luaL_optint(L, 2, 1);
  e = luaL_opt(L, luaL_checkint, 3, luaL_getn(L, 1));
  if (i > e) return 0;  /* empty range */
  n = e - i + 1;  /* number of elements */
  if (n <= 0 || !lua_checkstack(L, n))  /* n <= 0 means arith. overflow */
    return luaL_error(L, "too many results to unpack");
  lua_rawgeti(L, 1, i);  /* push arg[i] (avoiding overflow problems) */
  while (i++ < e)  /* push arg[i + 1...e] */
    lua_rawgeti(L, 1, i);
  return n;
}